

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O3

void __thiscall CTxMemPool::UpdateChild(CTxMemPool *this,txiter entry,txiter child,bool add)

{
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  *this_00;
  long lVar1;
  long lVar2;
  undefined3 in_register_00000009;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_>,_bool> pVar3;
  pair<std::_Rb_tree_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_>,_std::_Rb_tree_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  pVar4;
  Children s;
  reference_wrapper<const_CTxMemPoolEntry> local_60;
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_data = (CTxMemPoolEntry *)child.node;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  if (CONCAT31(in_register_00000009,add) == 0) {
    this_00 = (_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)((long)&((entry.node)->
                         super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                         ).
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                         .
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                         .
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                         .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                         super_pod_value_holder<CTxMemPoolEntry>.space + 0x40);
    pVar4 = std::
            _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
            ::equal_range(this_00,&local_60);
    lVar1 = *(long *)((long)&((entry.node)->
                             super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                             ).
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                             .
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                             .
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                             .
                             super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                             .super_pod_value_holder<CTxMemPoolEntry>.space + 0x68);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::_M_erase_aux(this_00,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
    lVar2 = -0x40;
    if (lVar1 == *(long *)((long)&((entry.node)->
                                  super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                  ).
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                  .
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                  .
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                  .
                                  super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                  .super_pod_value_holder<CTxMemPoolEntry>.space + 0x68))
    goto LAB_003d6f1a;
  }
  else {
    pVar3 = std::
            _Rb_tree<std::reference_wrapper<CTxMemPoolEntry_const>,std::reference_wrapper<CTxMemPoolEntry_const>,std::_Identity<std::reference_wrapper<CTxMemPoolEntry_const>>,CompareIteratorByHash,std::allocator<std::reference_wrapper<CTxMemPoolEntry_const>>>
            ::_M_insert_unique<std::reference_wrapper<CTxMemPoolEntry_const>>
                      ((_Rb_tree<std::reference_wrapper<CTxMemPoolEntry_const>,std::reference_wrapper<CTxMemPoolEntry_const>,std::_Identity<std::reference_wrapper<CTxMemPoolEntry_const>>,CompareIteratorByHash,std::allocator<std::reference_wrapper<CTxMemPoolEntry_const>>>
                        *)((long)&((entry.node)->
                                  super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                  ).
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                  .
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                  .
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                  .
                                  super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                  .super_pod_value_holder<CTxMemPoolEntry>.space + 0x40),&local_60);
    lVar2 = 0x40;
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
    goto LAB_003d6f1a;
  }
  this->cachedInnerUsage = this->cachedInnerUsage + lVar2;
LAB_003d6f1a:
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CTxMemPool::UpdateChild(txiter entry, txiter child, bool add)
{
    AssertLockHeld(cs);
    CTxMemPoolEntry::Children s;
    if (add && entry->GetMemPoolChildren().insert(*child).second) {
        cachedInnerUsage += memusage::IncrementalDynamicUsage(s);
    } else if (!add && entry->GetMemPoolChildren().erase(*child)) {
        cachedInnerUsage -= memusage::IncrementalDynamicUsage(s);
    }
}